

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SPIRVShaderResources.cpp
# Opt level: O3

void __thiscall
Diligent::SPIRVShaderResourceAttribs::SPIRVShaderResourceAttribs
          (SPIRVShaderResourceAttribs *this,Compiler *Compiler,Resource *Res,char *_Name,
          ResourceType _Type,Uint32 _BufferStaticSize,Uint32 _BufferStride)

{
  byte bVar1;
  unsigned_short uVar2;
  uint32_t uVar3;
  SPIRType *pSVar4;
  
  this->Name = _Name;
  uVar2 = GetResourceArraySize<unsigned_short_const>(Compiler,Res);
  this->ArraySize = uVar2;
  this->Type = _Type;
  pSVar4 = diligent_spirv_cross::Compiler::get_type(Compiler,(TypeID)(Res->type_id).id);
  if ((pSVar4->basetype & ~Void) == Image) {
    switch((pSVar4->image).dim) {
    case Dim1D:
      bVar1 = (pSVar4->image).arrayed | 2;
      break;
    case Dim2D:
      bVar1 = (pSVar4->image).arrayed | 4;
      break;
    case Dim3D:
      bVar1 = 6;
      break;
    case Cube:
      bVar1 = (pSVar4->image).arrayed + 7;
      break;
    default:
      goto switchD_002a547f_caseD_4;
    case Buffer:
      bVar1 = 1;
    }
  }
  else {
switchD_002a547f_caseD_4:
    bVar1 = 0;
  }
  this->field_0xb = this->field_0xb & 0x80 | bVar1;
  pSVar4 = diligent_spirv_cross::Compiler::get_type(Compiler,(TypeID)(Res->type_id).id);
  this->field_0xb =
       this->field_0xb & 0x7f | ((pSVar4->basetype & ~Void) == Image & (pSVar4->image).ms) << 7;
  uVar3 = GetDecorationOffset(Compiler,Res,Binding);
  this->BindingDecorationOffset = uVar3;
  uVar3 = GetDecorationOffset(Compiler,Res,DecorationDescriptorSet);
  this->DescriptorSetDecorationOffset = uVar3;
  this->BufferStaticSize = _BufferStaticSize;
  this->BufferStride = _BufferStride;
  return;
}

Assistant:

SPIRVShaderResourceAttribs::SPIRVShaderResourceAttribs(const diligent_spirv_cross::Compiler& Compiler,
                                                       const diligent_spirv_cross::Resource& Res,
                                                       const char*                           _Name,
                                                       ResourceType                          _Type,
                                                       Uint32                                _BufferStaticSize,
                                                       Uint32                                _BufferStride) noexcept :
    // clang-format off
    Name                          {_Name},
    ArraySize                     {GetResourceArraySize<decltype(ArraySize)>(Compiler, Res)},
    Type                          {_Type},
    ResourceDim                   {Diligent::GetResourceDimension(Compiler, Res)},
    IsMS                          {Diligent::IsMultisample(Compiler, Res) ? Uint8{1} : Uint8{0}},
    BindingDecorationOffset       {GetDecorationOffset(Compiler, Res, spv::Decoration::DecorationBinding)},
    DescriptorSetDecorationOffset {GetDecorationOffset(Compiler, Res, spv::Decoration::DecorationDescriptorSet)},
    BufferStaticSize              {_BufferStaticSize},
    BufferStride                  {_BufferStride}
// clang-format on
{}